

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O1

float miniply::angle_at_vert
                (uint32_t idx,vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> *points2D,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *prev,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *next)

{
  Vec2 VVar1;
  Vec2 VVar2;
  pointer pVVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  pVVar3 = (points2D->super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  VVar1 = pVVar3[(next->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[idx]];
  VVar2 = pVVar3[idx];
  fVar7 = VVar1.x - VVar2.x;
  fVar8 = VVar1.y - VVar2.y;
  fVar4 = fVar7 * fVar7 + fVar8 * fVar8;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  pVVar3 = (points2D->super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  VVar1 = pVVar3[(prev->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[idx]];
  VVar2 = pVVar3[idx];
  fVar5 = VVar1.x - VVar2.x;
  fVar6 = VVar1.y - VVar2.y;
  fVar4 = atan2f((fVar7 / fVar4) * fVar6 - fVar5 * (fVar8 / fVar4),
                 fVar5 * (fVar7 / fVar4) + fVar6 * (fVar8 / fVar4));
  return (float)(-(uint)(fVar4 <= 0.0) & 0x461c4000 |
                ~-(uint)(fVar4 <= 0.0) &
                (-(uint)(3.1415927 <= fVar4) & 0x461c4000 |
                ~-(uint)(3.1415927 <= fVar4) & (uint)fVar4));
}

Assistant:

static float angle_at_vert(uint32_t idx,
                             const std::vector<Vec2>& points2D,
                             const std::vector<uint32_t>& prev,
                             const std::vector<uint32_t>& next)
  {
    Vec2 xaxis = normalize(points2D[next[idx]] - points2D[idx]);
    Vec2 yaxis = Vec2{-xaxis.y, xaxis.x};
    Vec2 p2p0 = points2D[prev[idx]] - points2D[idx];
    float angle = std::atan2(dot(p2p0, yaxis), dot(p2p0, xaxis));
    if (angle <= 0.0f || angle >= kPi) {
      angle = 10000.0f;
    }
    return angle;
  }